

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

wstring * booster::locale::impl_posix::ftime_traits<wchar_t>::ftime_abi_cxx11_
                    (wchar_t *format,tm *t,locale_t lc)

{
  char *pcVar1;
  __locale_t in_RCX;
  char *in_RDX;
  wstring *in_RDI;
  string nres;
  string nformat;
  string enc;
  string *charset;
  undefined4 in_stack_ffffffffffffff68;
  method_type in_stack_ffffffffffffff6c;
  string *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [24];
  locale_t in_stack_ffffffffffffffd8;
  
  pcVar1 = nl_langinfo_l(0xe,in_RCX);
  charset = (string *)&local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,pcVar1,(allocator *)charset);
  std::allocator<char>::~allocator(&local_41);
  conv::from_utf<wchar_t>
            ((wchar_t *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),charset,
             (method_type)((ulong)pcVar1 >> 0x20));
  std::__cxx11::string::c_str();
  ftime_traits<char>::ftime_abi_cxx11_(in_RDX,(tm *)in_RCX,in_stack_ffffffffffffffd8);
  conv::to_utf<wchar_t>
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

static std::wstring ftime(wchar_t const *format,const struct tm *t,locale_t lc)
    {
        #ifdef HAVE_WCSFTIME_L
            wchar_t buf[16];
            size_t n=wcsftime_l(buf,sizeof(buf)/sizeof(buf[0]),format,t,lc);
            if(n == 0) {
                // should be big enough
                //
                // Note standard specifies that in case of the error
                // the function returns 0, however 0 may be actually
                // valid output value of for example empty format or an
                // output of %p in some locales
                //
                // Thus we try to guess that 1024 would be enough.
                std::vector<wchar_t> v(1024);
                n = wcsftime_l(&v.front(),1024,format,t,lc);
            }
            return std::wstring(&v.front(),n);
        #else
            std::string enc = nl_langinfo_l(CODESET,lc);
            std::string nformat = conv::from_utf<wchar_t>(format,enc);
            std::string nres = ftime_traits<char>::ftime(nformat.c_str(),t,lc);
            return conv::to_utf<wchar_t>(nres,enc);
        #endif
    }